

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestTestHandler::AddTest
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  cmCTest *pcVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  bool collapse;
  pointer __lhs;
  char *local_360 [4];
  cmCTestTestProperties test;
  ostringstream cmCTestLog_msg_3;
  
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&test);
  poVar5 = std::operator<<((ostream *)&test,"Add test: ");
  poVar5 = std::operator<<(poVar5,(string *)
                                  (args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x8dd,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&test);
  if (((this->UseExcludeRegExpFlag == true) && (this->UseExcludeRegExpFirst == true)) &&
     (bVar3 = cmsys::RegularExpression::find
                        (&this->ExcludeTestsRegularExpression,(__rhs->_M_dataplus)._M_p), bVar3)) {
    return true;
  }
  __lhs = (this->CustomTestsIgnore).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (this->MemCheck == false) {
    for (; __lhs != (this->CustomTestsIgnore).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      _Var4 = std::operator==(__lhs,__rhs);
      if (_Var4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&test);
        poVar5 = std::operator<<((ostream *)&test,"Ignore test: ");
        poVar5 = std::operator<<(poVar5,(string *)__lhs);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x909,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
        goto LAB_002ebff7;
      }
    }
  }
  else {
    for (; __lhs != (this->CustomTestsIgnore).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      _Var4 = std::operator==(__lhs,__rhs);
      if (_Var4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&test);
        poVar5 = std::operator<<((ostream *)&test,"Ignore memcheck: ");
        poVar5 = std::operator<<(poVar5,(string *)__lhs);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x8f5,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
LAB_002ebff7:
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&test);
        return true;
      }
    }
  }
  test.Name._M_dataplus._M_p = (pointer)&test.Name.field_2;
  test.Name._M_string_length = 0;
  test.Name.field_2._M_local_buf[0] = '\0';
  test.Directory._M_dataplus._M_p = (pointer)&test.Directory.field_2;
  test.Directory._M_string_length = 0;
  test.Directory.field_2._M_local_buf[0] = '\0';
  p_Var1 = &test.Measurements._M_t._M_impl.super__Rb_tree_header;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&test.Args,0,0xa8);
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  test.Environment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test.Environment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test.Environment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test.Labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test.Labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test.Labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_assign((string *)&test);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&test.Args,args);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&cmCTestLog_msg_3,(SystemTools *)0x1,collapse);
  std::__cxx11::string::operator=((string *)&test.Directory,(string *)&cmCTestLog_msg_3);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_3,"Set test directory: ");
  poVar5 = std::operator<<(poVar5,(string *)&test.Directory);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x913,local_360[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_360);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
  test.IsInBasedOnREOptions = true;
  test.WillFail = false;
  test.RunSerial = false;
  test.Timeout = 0.0;
  test.ExplicitTimeout = false;
  test.Cost = 0.0;
  test.PreviousRuns = 0;
  test.Processors = 1;
  test.SkipReturnCode = -1;
  if (((this->UseIncludeRegExpFlag == true) &&
      (bVar3 = cmsys::RegularExpression::find
                         (&this->IncludeTestsRegularExpression,(__rhs->_M_dataplus)._M_p), !bVar3))
     || ((this->UseExcludeRegExpFlag == true &&
         ((this->UseExcludeRegExpFirst == false &&
          (bVar3 = cmsys::RegularExpression::find
                             (&this->ExcludeTestsRegularExpression,(__rhs->_M_dataplus)._M_p), bVar3
          )))))) {
    test._280_2_ = test._280_2_ & 0xff00;
  }
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::push_back(&this->TestList,&test);
  cmCTestTestProperties::~cmCTestTestProperties(&test);
  return true;
}

Assistant:

bool cmCTestTestHandler::AddTest(const std::vector<std::string>& args)
{
  const std::string& testname = args[0];
  cmCTestOptionalLog(this->CTest, DEBUG, "Add test: " << args[0] << std::endl,
    this->Quiet);

  if (this->UseExcludeRegExpFlag &&
    this->UseExcludeRegExpFirst &&
    this->ExcludeTestsRegularExpression.find(testname.c_str()))
    {
    return true;
    }
  if ( this->MemCheck )
    {
    std::vector<std::string>::iterator it;
    bool found = false;
    for ( it = this->CustomTestsIgnore.begin();
      it != this->CustomTestsIgnore.end(); ++ it )
      {
      if ( *it == testname )
        {
        found = true;
        break;
        }
      }
    if ( found )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
        "Ignore memcheck: " << *it << std::endl, this->Quiet);
      return true;
      }
    }
  else
    {
    std::vector<std::string>::iterator it;
    bool found = false;
    for ( it = this->CustomTestsIgnore.begin();
      it != this->CustomTestsIgnore.end(); ++ it )
      {
      if ( *it == testname )
        {
        found = true;
        break;
        }
      }
    if ( found )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Ignore test: "
        << *it << std::endl, this->Quiet);
      return true;
      }
    }

  cmCTestTestProperties test;
  test.Name = testname;
  test.Args = args;
  test.Directory = cmSystemTools::GetCurrentWorkingDirectory();
  cmCTestOptionalLog(this->CTest, DEBUG, "Set test directory: "
    << test.Directory << std::endl, this->Quiet);

  test.IsInBasedOnREOptions = true;
  test.WillFail = false;
  test.RunSerial = false;
  test.Timeout = 0;
  test.ExplicitTimeout = false;
  test.Cost = 0;
  test.Processors = 1;
  test.SkipReturnCode = -1;
  test.PreviousRuns = 0;
  if (this->UseIncludeRegExpFlag &&
    !this->IncludeTestsRegularExpression.find(testname.c_str()))
    {
    test.IsInBasedOnREOptions = false;
    }
  else if (this->UseExcludeRegExpFlag &&
    !this->UseExcludeRegExpFirst &&
    this->ExcludeTestsRegularExpression.find(testname.c_str()))
    {
    test.IsInBasedOnREOptions = false;
    }
  this->TestList.push_back(test);
  return true;
}